

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O3

int __thiscall
QPlainTextEditControl::hitTest(QPlainTextEditControl *this,QPointF *point,HitTestAccuracy param_2)

{
  double dVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  long *plVar8;
  undefined8 extraout_RDX;
  int iVar9;
  long in_FS_OFFSET;
  double dVar10;
  double dVar11;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined8 local_88;
  double dStack_80;
  undefined8 local_78;
  double dStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetTextControl::document((QWidgetTextControl *)this);
  QTextDocument::findBlockByNumber((int)&local_48);
  cVar2 = QTextBlock::isValid();
  iVar3 = -1;
  if (cVar2 != '\0') {
    QWidgetTextControl::document((QWidgetTextControl *)this);
    QTextDocument::documentLayout();
    plVar8 = (long *)QMetaObject::cast((QObject *)&QPlainTextDocumentLayout::staticMetaObject);
    local_78 = 0xffffffffffffffff;
    dStack_70 = -NAN;
    local_88 = 0xffffffffffffffff;
    dStack_80 = -NAN;
    (**(code **)(*plVar8 + 0x88))(&local_88,plVar8,&local_48);
    QTextBlock::next();
    cVar2 = QTextBlock::isValid();
    dVar11 = 0.0;
    if (cVar2 != '\0') {
      do {
        if (point->yp < dStack_80 + dStack_70 + dVar11) break;
        dVar11 = dVar11 + dStack_70;
        QTextBlock::next();
        local_48 = (undefined1 *)CONCAT44(uStack_64,local_68);
        puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,uStack_60);
        (**(code **)(*plVar8 + 0x88))(&local_68,plVar8,&local_48);
        local_88 = CONCAT44(uStack_64,local_68);
        dStack_80 = (double)CONCAT44(uStack_5c,uStack_60);
        local_78 = CONCAT44(uStack_54,local_58);
        dStack_70 = (double)CONCAT44(uStack_4c,uStack_50);
        QTextBlock::next();
        cVar2 = QTextBlock::isValid();
      } while (cVar2 != '\0');
    }
    QTextBlock::previous();
    cVar2 = QTextBlock::isValid();
    if (cVar2 != '\0') {
      do {
        if (dStack_80 + dVar11 < point->yp || dStack_80 + dVar11 == point->yp) break;
        dVar11 = dVar11 - dStack_70;
        QTextBlock::previous();
        local_48 = (undefined1 *)CONCAT44(uStack_64,local_68);
        puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,uStack_60);
        (**(code **)(*plVar8 + 0x88))(&local_68,plVar8,&local_48);
        local_88 = CONCAT44(uStack_64,local_68);
        dStack_80 = (double)CONCAT44(uStack_5c,uStack_60);
        local_78 = CONCAT44(uStack_54,local_58);
        dStack_70 = (double)CONCAT44(uStack_4c,uStack_50);
        QTextBlock::previous();
        cVar2 = QTextBlock::isValid();
      } while (cVar2 != '\0');
    }
    cVar2 = QTextBlock::isValid();
    iVar3 = -1;
    if (cVar2 != '\0') {
      iVar3 = QTextBlock::layout();
      dVar1 = point->xp;
      dVar10 = point->yp;
      iVar4 = QTextLayout::lineCount();
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      else {
        dVar10 = dVar10 - dVar11;
        iVar9 = 0;
        iVar4 = 0;
        do {
          local_98 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
          uVar5 = QTextLayout::lineAt(iVar3);
          local_98 = (undefined1 *)CONCAT44(local_98._4_4_,uVar5);
          local_58 = 0xffffffff;
          uStack_54 = 0xffffffff;
          uStack_50 = 0xffffffff;
          uStack_4c = 0xffffffff;
          local_68 = 0xffffffff;
          uStack_64 = 0xffffffff;
          uStack_60 = 0xffffffff;
          uStack_5c = 0xffffffff;
          puStack_90 = (undefined1 *)extraout_RDX;
          QTextLine::naturalTextRect();
          if ((double)CONCAT44(uStack_5c,uStack_60) <= dVar10) {
            if (dVar10 < (double)CONCAT44(uStack_5c,uStack_60) +
                         (double)CONCAT44(uStack_4c,uStack_50)) {
              QWidgetTextControl::overwriteMode((QWidgetTextControl *)this);
              iVar4 = QTextLine::xToCursor(dVar1,(CursorPosition)&local_98);
              break;
            }
            iVar6 = QTextLine::textStart();
            iVar7 = QTextLine::textLength();
            if (iVar4 <= iVar7 + iVar6) {
              iVar4 = iVar7 + iVar6;
            }
          }
          else {
            iVar6 = QTextLine::textStart();
            if (iVar6 <= iVar4) {
              iVar4 = iVar6;
            }
          }
          iVar9 = iVar9 + 1;
          iVar6 = QTextLayout::lineCount();
        } while (iVar9 < iVar6);
      }
      iVar3 = QTextBlock::position();
      iVar3 = iVar3 + iVar4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

int QPlainTextEditControl::hitTest(const QPointF &point, Qt::HitTestAccuracy ) const {
    int currentBlockNumber = topBlock;
    QTextBlock currentBlock = document()->findBlockByNumber(currentBlockNumber);
    if (!currentBlock.isValid())
        return -1;

    QPlainTextDocumentLayout *documentLayout = qobject_cast<QPlainTextDocumentLayout*>(document()->documentLayout());
    Q_ASSERT(documentLayout);

    QPointF offset;
    QRectF r = documentLayout->blockBoundingRect(currentBlock);
    while (currentBlock.next().isValid() && r.bottom() + offset.y() <= point.y()) {
        offset.ry() += r.height();
        currentBlock = currentBlock.next();
        ++currentBlockNumber;
        r = documentLayout->blockBoundingRect(currentBlock);
    }
    while (currentBlock.previous().isValid() && r.top() + offset.y() > point.y()) {
        offset.ry() -= r.height();
        currentBlock = currentBlock.previous();
        --currentBlockNumber;
        r = documentLayout->blockBoundingRect(currentBlock);
    }


    if (!currentBlock.isValid())
        return -1;
    QTextLayout *layout = currentBlock.layout();
    int off = 0;
    QPointF pos = point - offset;
    for (int i = 0; i < layout->lineCount(); ++i) {
        QTextLine line = layout->lineAt(i);
        const QRectF lr = line.naturalTextRect();
        if (lr.top() > pos.y()) {
            off = qMin(off, line.textStart());
        } else if (lr.bottom() <= pos.y()) {
            off = qMax(off, line.textStart() + line.textLength());
        } else {
            off = line.xToCursor(pos.x(), overwriteMode() ?
                                 QTextLine::CursorOnCharacter : QTextLine::CursorBetweenCharacters);
            break;
        }
    }

    return currentBlock.position() + off;
}